

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

int Acb_NtkNodeRef_rec(Vec_Int_t *vRefs,Acb_Ntk_t *p,int iObj,int *nGates)

{
  char cVar1;
  int iObj_00;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  cVar1 = (p->vObjType).pArray[(uint)iObj];
  iVar6 = 0;
  if (cVar1 != '\x03') {
    if (nGates != (int *)0x0) {
      if ((p->vObjFans).nSize <= iObj) goto LAB_003a9996;
      iVar6 = (p->vObjFans).pArray[(uint)iObj];
      if (((long)iVar6 < 0) || ((p->vFanSto).nSize <= iVar6)) goto LAB_003a99d4;
      iVar6 = (p->vFanSto).pArray[iVar6];
      switch(cVar1) {
      case '\x04':
      case '\v':
        nGates[2] = nGates[2] + 1;
        break;
      default:
        if (iVar6 < 2) {
          __assert_fail("nFan >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                        ,0xcb,"int Acb_NtkNodeRef_rec(Vec_Int_t *, Acb_Ntk_t *, int, int *)");
        }
        nGates[4] = nGates[4] + iVar6 + -1;
        break;
      case '\a':
        *nGates = *nGates + 1;
        break;
      case '\b':
        nGates[1] = nGates[1] + 1;
        break;
      case '\f':
        nGates[3] = nGates[3] + 1;
      }
    }
    if ((p->vObjFans).nSize <= iObj) {
LAB_003a9996:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar6 = (p->vObjFans).pArray[(uint)iObj];
    lVar4 = (long)iVar6;
    if ((lVar4 < 0) || ((p->vFanSto).nSize <= iVar6)) {
LAB_003a99d4:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar2 = (p->vFanSto).pArray;
    if (piVar2[lVar4] < 1) {
      iVar6 = 1;
    }
    else {
      iVar6 = 1;
      lVar5 = 0;
      do {
        iObj_00 = piVar2[lVar4 + lVar5 + 1];
        lVar7 = (long)iObj_00;
        if ((lVar7 < 0) || (vRefs->nSize <= iObj_00)) goto LAB_003a9996;
        if (vRefs->pArray[lVar7] == 0) {
          iVar3 = Acb_NtkNodeRef_rec(vRefs,p,iObj_00,nGates);
          iVar6 = iVar6 + iVar3;
        }
        if (vRefs->nSize <= iObj_00) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        vRefs->pArray[lVar7] = vRefs->pArray[lVar7] + 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 < piVar2[lVar4]);
    }
  }
  return iVar6;
}

Assistant:

int Acb_NtkNodeRef_rec( Vec_Int_t * vRefs, Acb_Ntk_t * p, int iObj, int nGates[5] )
{
    int i, Fanin, * pFanins, Counter = 1;
    if ( Acb_ObjIsCi(p, iObj) )
        return 0;
    if ( nGates )
    {
        int nFan = Acb_ObjFaninNum(p, iObj);
        int Type = Acb_ObjType( p, iObj );
        if ( Type == ABC_OPER_CONST_F ) 
            nGates[0]++;
        else if ( Type == ABC_OPER_CONST_T ) 
            nGates[1]++;
        else if ( Type == ABC_OPER_BIT_BUF || Type == ABC_OPER_CO ) 
            nGates[2]++;
        else if ( Type == ABC_OPER_BIT_INV ) 
            nGates[3]++;
        else
        {
            assert( nFan >= 2 );
            nGates[4] += Acb_ObjFaninNum(p, iObj)-1;
        }
    }
    Acb_ObjForEachFaninFast( p, iObj, pFanins, Fanin, i )
    {
        if ( Vec_IntEntry(vRefs, Fanin) == 0 )
            Counter += Acb_NtkNodeRef_rec( vRefs, p, Fanin, nGates );
        Vec_IntAddToEntry( vRefs, Fanin, 1 );
    }
    return Counter;
}